

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

cvui_context_t * cvui::internal::getContext(String *theWindowName)

{
  mapped_type *pmVar1;
  undefined8 extraout_RAX;
  string local_30;
  
  if (theWindowName->_M_string_length == 0) {
    if (gCurrentContext_abi_cxx11_._8_8_ == 0) {
      if (gDefaultContext_abi_cxx11_._8_8_ == 0) {
        local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_30,
                   "Unable to read context. Did you forget to call cvui::init()?","");
        error(5,&local_30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      theWindowName = (String *)gDefaultContext_abi_cxx11_;
    }
    else {
      theWindowName = (String *)gCurrentContext_abi_cxx11_;
    }
  }
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvui::cvui_context_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvui::cvui_context_t>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvui::cvui_context_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvui::cvui_context_t>_>_>
                         *)gContexts_abi_cxx11_,theWindowName);
  return pmVar1;
}

Assistant:

cvui_context_t& getContext(const cv::String& theWindowName) {
		if (!theWindowName.empty()) {
			// Get context in particular
			return internal::gContexts[theWindowName];

		} else if (!internal::gCurrentContext.empty()) {
			// No window provided, return currently active context.
			return internal::gContexts[internal::gCurrentContext];

		} else if (!internal::gDefaultContext.empty()) {
			// We have no active context, so let's use the default one.
			return internal::gContexts[internal::gDefaultContext];

		} else {
			// Apparently we have no window at all! <o>
			// This should not happen. Probably cvui::init() was never called.
			internal::error(5, "Unable to read context. Did you forget to call cvui::init()?");
			return internal::gContexts["first"]; // return to make the compiler happy.
		}
	}